

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void oslar_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint32_t uVar1;
  uint32_t local_24;
  int oslock;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  if (ri->state == 0) {
    local_24 = (uint32_t)(value == 0xc5acce55);
  }
  else {
    local_24 = (uint)value & 1;
  }
  uVar1 = deposit32((uint32_t)(env->cp15).oslsr_el1,1,1,local_24);
  (env->cp15).oslsr_el1 = (ulong)uVar1;
  return;
}

Assistant:

static void oslar_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    /* Writes to OSLAR_EL1 may update the OS lock status, which can be
     * read via a bit in OSLSR_EL1.
     */
    int oslock;

    if (ri->state == ARM_CP_STATE_AA32) {
        oslock = (value == 0xC5ACCE55);
    } else {
        oslock = value & 1;
    }

    env->cp15.oslsr_el1 = deposit32(env->cp15.oslsr_el1, 1, 1, oslock);
}